

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

bool __thiscall
nlohmann::detail::
lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
::next_byte_in_range
          (lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
           *this,initializer_list<int> ranges)

{
  ulong uVar1;
  long lVar2;
  int *piVar3;
  char cVar4;
  
  uVar1 = ranges._M_len;
  piVar3 = ranges._M_array;
  if ((6 < uVar1) || ((0x54UL >> (uVar1 & 0x3f) & 1) == 0)) {
    __assert_fail("ranges.size() == 2 or ranges.size() == 4 or ranges.size() == 6",
                  "/workspace/llm4binary/github/license_c_cmakelists/mattn[P]clask/example/login/./nlohmann/json.hpp"
                  ,0x1ca2,
                  "bool nlohmann::detail::lexer<nlohmann::basic_json<>>::next_byte_in_range(std::initializer_list<int>) [BasicJsonType = nlohmann::basic_json<>]"
                 );
  }
  cVar4 = (char)this + 'H';
  std::__cxx11::string::push_back(cVar4);
  lVar2 = uVar1 << 2;
  do {
    if (lVar2 == 0) {
LAB_0010e66a:
      return lVar2 == 0;
    }
    get(this);
    if ((this->current < *piVar3) || (piVar3[1] < this->current)) {
      this->error_message = "invalid string: ill-formed UTF-8 byte";
      goto LAB_0010e66a;
    }
    std::__cxx11::string::push_back(cVar4);
    piVar3 = piVar3 + 2;
    lVar2 = lVar2 + -8;
  } while( true );
}

Assistant:

bool next_byte_in_range(std::initializer_list<int> ranges)
    {
        assert(ranges.size() == 2 or ranges.size() == 4 or ranges.size() == 6);
        add(current);

        for (auto range = ranges.begin(); range != ranges.end(); ++range)
        {
            get();
            if (JSON_HEDLEY_LIKELY(*range <= current and current <= *(++range)))
            {
                add(current);
            }
            else
            {
                error_message = "invalid string: ill-formed UTF-8 byte";
                return false;
            }
        }

        return true;
    }